

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErrorHandling.cpp
# Opt level: O3

void llvm::remove_fatal_error_handler(void)

{
  int iVar1;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&ErrorHandlerMutex);
  if (iVar1 == 0) {
    ErrorHandler_abi_cxx11_ = (fatal_error_handler_t)0x0;
    ErrorHandlerUserData = (void *)0x0;
    pthread_mutex_unlock((pthread_mutex_t *)&ErrorHandlerMutex);
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

void llvm::remove_fatal_error_handler() {
#if LLVM_ENABLE_THREADS == 1
  std::lock_guard<std::mutex> Lock(ErrorHandlerMutex);
#endif
  ErrorHandler = nullptr;
  ErrorHandlerUserData = nullptr;
}